

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyOrthonormal<float>(Matrix33<float> *A)

{
  Matrix33<float> *pMVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int j;
  int i;
  Matrix33<float> prod;
  float valueEps;
  int local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  int i_00;
  undefined4 in_stack_ffffffffffffffac;
  Matrix33<float> *in_stack_ffffffffffffffc0;
  Matrix33<float> *in_stack_ffffffffffffffc8;
  Matrix33<float> local_30;
  float local_c;
  
  local_c = std::numeric_limits<float>::epsilon();
  local_c = local_c * 100.0;
  Imath_2_5::Matrix33<float>::transposed
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  Imath_2_5::Matrix33<float>::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  i_00 = 0;
  do {
    if (2 < i_00) {
      return;
    }
    for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
      if (i_00 == local_5c) {
        pMVar1 = &local_30;
        Imath_2_5::Matrix33<float>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (1.1920929e-05 <= extraout_XMM0_Da) {
          __assert_fail("std::abs (prod[i][j] - 1) < valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x3a,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = float]");
        }
      }
      else {
        pMVar1 = &local_30;
        Imath_2_5::Matrix33<float>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (1.1920929e-05 <= extraout_XMM0_Da_00) {
          __assert_fail("std::abs (prod[i][j]) < valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x3c,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = float]");
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}